

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseComponent.cpp
# Opt level: O3

void __thiscall BaseComponent::BaseComponent(BaseComponent *this)

{
  BaseStoppable::BaseStoppable(&this->super_BaseStoppable);
  (this->super_BaseStoppable).super_BaseThread._vptr_BaseThread = (_func_int **)&PTR_Run_00108c00;
  (this->queue).c.super__Deque_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->queue).c.super__Deque_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->queue).c.super__Deque_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->queue).c.super__Deque_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->queue).c.super__Deque_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->queue).c.super__Deque_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->queue).c.super__Deque_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->queue).c.super__Deque_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->queue).c.super__Deque_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->queue).c.super__Deque_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<Event_*,_std::allocator<Event_*>_>::_M_initialize_map
            ((_Deque_base<Event_*,_std::allocator<Event_*>_> *)&this->queue,0);
  *(undefined8 *)((long)&(this->queueLock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->queueLock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->queueLock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->queueLock).super___mutex_base._M_mutex + 8) = 0;
  (this->queueLock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  return;
}

Assistant:

BaseComponent::BaseComponent() :
    BaseStoppable() {}